

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

bool sanityCheck(QList<QWidget_*> *widgets,int index,char *where)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  undefined8 in_RDX;
  int in_ESI;
  QList<QWidget_*> *in_RDI;
  long in_FS_OFFSET;
  char error_1 [13];
  char error [19];
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar3;
  bool local_79;
  char local_78 [32];
  char local_58 [35];
  char local_35 [13];
  undefined8 local_28;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = true;
  if (-1 < in_ESI) {
    in_stack_ffffffffffffff58 = (char *)(long)in_ESI;
    qVar1 = QList<QWidget_*>::size(in_RDI);
    uVar3 = qVar1 <= (long)in_stack_ffffffffffffff58;
  }
  if ((bool)uVar3 == false) {
    ppQVar2 = QList<QWidget_*>::at
                        ((QList<QWidget_*> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (qsizetype)in_stack_ffffffffffffff48);
    if (*ppQVar2 == (QWidget *)0x0) {
      builtin_strncpy(local_35,"null pointer",0xd);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(uVar3,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
      QMessageLogger::warning(local_78,"%s:%s",in_RDX,local_35);
      local_79 = false;
    }
    else {
      local_79 = true;
    }
  }
  else {
    local_28._0_1_ = 'i';
    local_28._1_1_ = 'n';
    local_28._2_1_ = 'd';
    local_28._3_1_ = 'e';
    local_28._4_1_ = 'x';
    local_28._5_1_ = ' ';
    local_28._6_1_ = 'o';
    local_28._7_1_ = 'u';
    builtin_strncpy(local_20,"t of range",0xb);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(uVar3,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
               ,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
    QMessageLogger::warning(local_58,"%s:%s",in_RDX,&local_28);
    local_79 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_79;
  }
  __stack_chk_fail();
}

Assistant:

static bool sanityCheck(const QList<QWidget *> &widgets, const int index, const char *where)
{
    if (Q_UNLIKELY(index < 0 || index >= widgets.size())) {
        const char error[] = "index out of range";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    if (Q_UNLIKELY(!widgets.at(index))) {
        const char error[] = "null pointer";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    return true;
}